

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O2

void __thiscall wasm::CoalesceLocals::calculateInterferences(CoalesceLocals *this)

{
  uint i_00;
  Function *this_00;
  pointer puVar1;
  BasicBlock *pBVar2;
  long lVar3;
  BasicBlock *pBVar4;
  uint *puVar5;
  Expression *expr;
  bool bVar6;
  Index IVar7;
  pointer puVar8;
  size_type sVar9;
  uint *puVar10;
  size_t sVar11;
  size_t sVar12;
  Type type;
  long lVar13;
  LocalSet *pLVar14;
  Index i;
  uint uVar15;
  pointer *ppuVar16;
  Index j;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  reference rVar20;
  SmallVector<wasm::Literal,_1UL> local_178;
  undefined1 local_140 [8];
  ValueNumbering valueNumbering;
  vector<bool,_std::allocator<bool>_> endsLiveRange;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  SetOfLocals live;
  allocator_type local_31;
  
  sparse_square_matrix<bool>::recreate
            (&this->interferences,
             (this->
             super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
             ).
             super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             numLocals);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
             (ulong)(this->
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                    .numLocals,(allocator_type *)local_140);
  local_140._0_4_ = 0;
  valueNumbering._0_8_ = &valueNumbering.literalValues._M_h._M_rehash_policy._M_next_resize;
  valueNumbering.literalValues._M_h._M_buckets = (__buckets_ptr)0x1;
  valueNumbering.literalValues._M_h._M_bucket_count = 0;
  valueNumbering.literalValues._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  valueNumbering.literalValues._M_h._M_element_count._0_4_ = 0x3f800000;
  valueNumbering.literalValues._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  valueNumbering.literalValues._M_h._M_rehash_policy._4_4_ = 0;
  valueNumbering.literalValues._M_h._M_rehash_policy._M_next_resize = 0;
  valueNumbering.literalValues._M_h._M_single_bucket =
       (__node_base_ptr)&valueNumbering.expressionValues._M_h._M_rehash_policy._M_next_resize;
  valueNumbering.expressionValues._M_h._M_buckets = (__buckets_ptr)0x1;
  valueNumbering.expressionValues._M_h._M_bucket_count = 0;
  valueNumbering.expressionValues._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  valueNumbering.expressionValues._M_h._M_element_count._0_4_ = 0x3f800000;
  valueNumbering.expressionValues._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  valueNumbering.expressionValues._M_h._M_rehash_policy._4_4_ = 0;
  valueNumbering.expressionValues._M_h._M_rehash_policy._M_next_resize = 0;
  this_00 = (this->
            super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
            ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
            .
            super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
            .
            super_ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
            .super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
            super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
            currFunction;
  puVar8 = (this->
           super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
           ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
           super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
           .basicBlocks.
           super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = *(pointer *)
            ((long)&(this->
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                    .
                    super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                    .basicBlocks.
                    super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  do {
    ppuVar16 = &values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (puVar8 == puVar1) {
      sVar11 = Function::getNumParams
                         ((this->
                          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                          ).
                          super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                          .
                          super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                          .
                          super_ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                          .
                          super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                          .
                          super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                          .currFunction);
      uVar18 = 0;
      while (uVar18 < sVar11) {
        uVar15 = (Index)uVar18 + 1;
        for (uVar17 = uVar15; uVar17 < sVar11; uVar17 = uVar17 + 1) {
          interfereLowHigh(this,(Index)uVar18,uVar17);
        }
        uVar18 = (ulong)uVar15;
      }
      pBVar2 = (this->
               super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
               ).
               super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
               .
               super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
               .entry;
      puVar5 = (pBVar2->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar10 = (pBVar2->contents).start.
                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar10 != puVar5; puVar10 = puVar10 + 1) {
        uVar17 = *puVar10;
        if (sVar11 <= uVar17) {
          for (uVar15 = 0; uVar15 < (uint)sVar11; uVar15 = uVar15 + 1) {
            interfereLowHigh(this,uVar15,uVar17);
          }
        }
      }
      ValueNumbering::~ValueNumbering((ValueNumbering *)local_140);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      return;
    }
    valueNumbering.expressionValues._M_h._M_single_bucket =
         (__node_base_ptr)
         (puVar8->_M_t).
         super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
         .
         super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
         ._M_head_impl;
    sVar9 = std::
            _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->
                     super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                     ).
                     super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .liveBlocks._M_h,
                    (key_type *)&valueNumbering.expressionValues._M_h._M_single_bucket);
    if (sVar9 != 0) {
      pBVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
               .
               super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
               ._M_head_impl;
      values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)
                 &valueNumbering.expressionValues._M_h._M_single_bucket,
                 ((long)*(pointer *)((long)&(pBVar2->contents).actions + 8) -
                 *(long *)&(pBVar2->contents).actions.
                           super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                           ._M_impl) / 0x18,(bool *)ppuVar16,&local_31);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar16,
                 &(((puVar8->_M_t).
                    super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                    .
                    super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                   ._M_head_impl)->contents).end.
                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      uVar18 = ((long)*(pointer *)((long)&(pBVar2->contents).actions + 8) -
               *(long *)&(pBVar2->contents).actions.
                         super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                         ._M_impl) / 0x18 & 0xffffffff;
      lVar19 = uVar18 * 0x18 + -8;
      while (0 < (int)uVar18) {
        uVar18 = uVar18 - 1;
        lVar3 = *(long *)&(pBVar2->contents).actions.
                          super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                          ._M_impl;
        IVar7 = *(Index *)(lVar3 + -0xc + lVar19);
        if (*(int *)(lVar3 + -0x10 + lVar19) == 0) {
          bVar6 = SortedVector::has((SortedVector *)
                                    &values.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,IVar7);
          if (!bVar6) {
            rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                &valueNumbering.expressionValues._M_h._M_single_bucket,uVar18);
            *rVar20._M_p = *rVar20._M_p | rVar20._M_mask;
            SortedVector::insert
                      ((SortedVector *)
                       &values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,IVar7);
          }
        }
        else {
          bVar6 = SortedVector::erase((SortedVector *)
                                      &values.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,IVar7);
          if (bVar6) {
            *(undefined1 *)(lVar3 + lVar19) = 1;
          }
        }
        lVar19 = lVar19 + -0x18;
      }
      bVar6 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &values.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (puVar8->_M_t).
                              super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                              .
                              super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                              ._M_head_impl);
      if (!bVar6) {
        __assert_fail("live == curr->contents.start",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                      ,0xc2,"void wasm::CoalesceLocals::calculateInterferences()");
      }
      pBVar4 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
               .
               super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
               ._M_head_impl;
      if (pBVar4 == (this->
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                    .
                    super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                    .entry) {
        uVar18 = 0;
        while( true ) {
          sVar11 = Function::getNumParams(this_00);
          if (sVar11 <= uVar18) break;
          *(undefined4 *)((long)local_80 + uVar18 * 4) = local_140._0_4_;
          uVar18 = (ulong)((int)uVar18 + 1);
          local_140._0_4_ = local_140._0_4_ + 1;
        }
        sVar11 = Function::getNumParams(this_00);
        while( true ) {
          sVar12 = Function::getNumLocals(this_00);
          uVar18 = sVar11 & 0xffffffff;
          if (sVar12 <= uVar18) break;
          type = Function::getLocalType(this_00,(Index)sVar11);
          bVar6 = LiteralUtils::canMakeZero(type);
          if (bVar6) {
            Literal::makeZeros((Literals *)&local_178,type);
            IVar7 = ValueNumbering::getValue((ValueNumbering *)local_140,(Literals *)&local_178);
            *(Index *)((long)local_80 + uVar18 * 4) = IVar7;
            SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_178);
          }
          else {
            *(undefined4 *)((long)local_80 + uVar18 * 4) = local_140._0_4_;
            local_140._0_4_ = local_140._0_4_ + 1;
          }
          sVar11 = (size_t)((Index)sVar11 + 1);
        }
      }
      else {
        puVar5 = *(pointer *)((long)&(pBVar4->contents).start + 8);
        for (puVar10 = *(uint **)&(pBVar4->contents).start; puVar10 != puVar5; puVar10 = puVar10 + 1
            ) {
          *(undefined4 *)((long)local_80 + (ulong)*puVar10 * 4) = local_140._0_4_;
          local_140._0_4_ = local_140._0_4_ + 1;
        }
      }
      uVar17 = 0;
      while( true ) {
        ppuVar16 = &values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        uVar18 = (ulong)uVar17;
        lVar19 = *(long *)&(pBVar2->contents).actions.
                           super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                           ._M_impl;
        if ((ulong)(((long)*(pointer *)((long)&(pBVar2->contents).actions + 8) - lVar19) / 0x18) <=
            uVar18) break;
        lVar13 = uVar18 * 0x18;
        lVar3 = lVar19 + lVar13;
        if (*(int *)(lVar19 + lVar13) == 0) {
          rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              &valueNumbering.expressionValues._M_h._M_single_bucket,uVar18);
          if ((*rVar20._M_p & rVar20._M_mask) != 0) {
            bVar6 = SortedVector::erase((SortedVector *)ppuVar16,*(Index *)(lVar3 + 4));
            if (!bVar6) {
              __assert_fail("erased",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                            ,0xf0,"void wasm::CoalesceLocals::calculateInterferences()");
            }
          }
        }
        else {
          uVar15 = *(uint *)(lVar19 + 4 + lVar13);
          pLVar14 = Expression::cast<wasm::LocalSet>((Expression *)**(undefined8 **)(lVar3 + 8));
          expr = pLVar14->value;
          if ((expr->_id & ~BlockId) == LocalGetId) {
            if (uVar18 == 0) {
LAB_007ea916:
              __assert_fail("i > 0 && set->value == *actions[i - 1].origin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                            ,0xfb,"void wasm::CoalesceLocals::calculateInterferences()");
            }
            lVar19 = *(long *)&(pBVar2->contents).actions.
                               super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                               ._M_impl;
            lVar13 = (ulong)(uVar17 - 1) * 0x18;
            if (expr != (Expression *)**(undefined8 **)(lVar19 + 8 + lVar13)) goto LAB_007ea916;
            IVar7 = *(Index *)((long)local_80 + (ulong)*(uint *)(lVar19 + lVar13 + 4) * 4);
          }
          else {
            IVar7 = ValueNumbering::getValue((ValueNumbering *)local_140,expr);
          }
          *(Index *)((long)local_80 + (ulong)uVar15 * 4) = IVar7;
          if (*(char *)(lVar3 + 0x10) == '\x01') {
            for (puVar10 = (uint *)CONCAT71(values.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_
                                            ,values.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _0_1_);
                puVar10 !=
                live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar10 = puVar10 + 1) {
              i_00 = *puVar10;
              if (i_00 == uVar15) {
                __assert_fail("other != index",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                              ,0x110,"void wasm::CoalesceLocals::calculateInterferences()");
              }
              if (*(Index *)((long)local_80 + (ulong)i_00 * 4) != IVar7) {
                interfere(this,i_00,uVar15);
              }
            }
            SortedVector::insert
                      ((SortedVector *)
                       &values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,*(Index *)(lVar3 + 4));
          }
        }
        uVar17 = uVar17 + 1;
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar16);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)
                 &valueNumbering.expressionValues._M_h._M_single_bucket);
    }
    puVar8 = puVar8 + 1;
  } while( true );
}

Assistant:

void CoalesceLocals::calculateInterferences() {
  interferences.recreate(numLocals);

  // We will track the values in each local, using a numbering where each index
  // represents a unique different value. This array maps a local index to the
  // value index it contains.
  //
  // To avoid reallocating this array all the time, allocate it once outside the
  // loop.
  std::vector<Index> values(numLocals);

  ValueNumbering valueNumbering;

  auto* func = getFunction();

  for (auto& curr : basicBlocks) {
    if (liveBlocks.count(curr.get()) == 0) {
      continue; // ignore dead blocks
    }

    // First, find which gets end a live range. While doing so, also calculate
    // the effectiveness of sets.
    auto& actions = curr->contents.actions;
    std::vector<bool> endsLiveRange(actions.size(), false);
    auto live = curr->contents.end;
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (!live.has(index)) {
          // The local is not live after us, so its liveness ends here.
          endsLiveRange[i] = true;
          live.insert(index);
        }
      } else {
        // This is a set. Check if the local is alive after it; if it is then
        // the set if effective as there is some get that can read the value.
        if (live.erase(index)) {
          action.effective = true;
        }
      }
    }

    // We have processed from the end of the block to the start, updating |live|
    // as we go, and now it must be equal to the state at the start of the
    // block. We will also use |live| in the next loop, and assume it begins
    // in that state.
    assert(live == curr->contents.start);

    // Now that we know live ranges, check if locals interfere in this block.
    // Locals interfere if they might contain different values on areas where
    // their live ranges overlap. To evaluate that, we do an analysis inside
    // the block that gives each set a unique value number, and as those flow
    // around through copies between sets we can see when sets are guaranteed to
    // be equal.

    if (curr.get() == entry) {
      // Each parameter is assumed to have a different value on entry.
      for (Index i = 0; i < func->getNumParams(); i++) {
        values[i] = valueNumbering.getUniqueValue();
      }

      for (Index i = func->getNumParams(); i < func->getNumLocals(); i++) {
        auto type = func->getLocalType(i);
        if (!LiteralUtils::canMakeZero(type)) {
          // The default value for a type for which we can't make a zero cannot
          // be used anyhow, but we must give it some value in this analysis. A
          // unique one seems least likely to result in surprise during
          // debugging.
          values[i] = valueNumbering.getUniqueValue();
        } else {
          values[i] = valueNumbering.getValue(Literal::makeZeros(type));
        }
      }
    } else {
      // In any block but the entry, assume that each live local might have a
      // different value at the start.
      // TODO: Propagating value IDs across blocks could identify more copies,
      //       however, it would also be nonlinear.
      for (auto index : curr->contents.start) {
        values[index] = valueNumbering.getUniqueValue();
      }
    }

    // Traverse through the block from start to finish. We keep track of both
    // liveness (in |live|) and the value IDs in each local (in |values|)
    // while doing so.
    for (Index i = 0; i < actions.size(); i++) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (endsLiveRange[i]) {
          [[maybe_unused]] bool erased = live.erase(action.index);
          assert(erased);
        }
        continue;
      }

      // This is a set. Find the value being assigned to the local.
      auto* set = (*action.origin)->cast<LocalSet>();
      Index newValue;
      if (set->value->is<LocalGet>() || set->value->is<LocalSet>()) {
        // This is a copy: Either it is a get or a tee, that occurs right
        // before us. Set our new value to theirs.
        assert(i > 0 && set->value == *actions[i - 1].origin);
        newValue = values[actions[i - 1].index];
      } else {
        // This is not a copy.
        newValue = valueNumbering.getValue(set->value);
      }
      values[index] = newValue;

      // If this set has no gets that read from it, then it does not start a
      // live range, and it cannot cause interference.
      if (!action.effective) {
        continue;
      }

      // Update interferences: This will interfere with any other local that
      // is currently live and contains a different value.
      for (auto other : live) {
        // This index cannot have been live before this set (as we would be
        // trampling some other set before us, if so; and then that set would
        // have been ineffective). We will mark this index as live right after
        // this loop).
        assert(other != index);
        if (values[other] != newValue) {
          interfere(other, index);
        }
      }
      live.insert(action.index);
    }

    // Note that we do not need to do anything for merges: while in general an
    // interference can happen either in a block or when control flow merges,
    // in wasm we have default values for all locals. As a result, if a local is
    // live at the beginning of a block, it will be live at the ends of *all*
    // the blocks reaching it: there is no possibility of an "unset local." That
    // is, imagine we have this merge with a conflict:
    //
    //  [a is set to some value] ->-
    //                              |
    //                              |->- [merge block where a and b are used]
    //                              |
    //  [b is set to some value] ->-
    //
    // It is true that a conflict happens in the merge block, and if we had
    // unset locals then the top block would have b unset, and the bottom block
    // would have a unset, and so there would be no conflict there and the
    // problem would only appear in the merge. But in wasm, that a and b are
    // used in the merge block means that they are live at the end of both the
    // top and bottom block, and that liveness will extend all the way back to
    // *some* set of those values, possibly only the zero-initialization at the
    // function start. Therefore a conflict will be noticed in both the top and
    // bottom blocks, and that merge block does not need to reason about merging
    // its inputs. In other words, a conflict will appear in the middle of a
    // block, somewhere, and therefore we leave it to that block to identify,
    // and so blocks only need to reason about their own contents and not what
    // arrives to them.
    //
    // The one exception here is the entry to the function, see below.
  }

  // We must not try to coalesce parameters as they are fixed. Mark them as
  // "interfering" so that we do not need to special-case them later.
  auto numParams = getFunction()->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    for (Index j = i + 1; j < numParams; j++) {
      interfereLowHigh(i, j);
    }
  }

  // We must handle interference between uses of the zero-init value and
  // parameters manually. A zero initialization represents a set (to a default
  // value), and that set would be what alerts us to a conflict, but there is no
  // actual set in the IR since the zero-init value is applied implicitly.
  for (auto i : entry->contents.start) {
    if (i >= numParams) {
      for (Index j = 0; j < numParams; j++) {
        interfereLowHigh(j, i);
      }
    }
  }
}